

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step1(Curl_easy *data,connectdata *conn,int sockindex)

{
  byte bVar1;
  ssl_backend_data *psVar2;
  long lVar3;
  connectdata *pcVar4;
  _Bool _Var5;
  int iVar6;
  SSL_CTX *pSVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  X509_STORE *pXVar11;
  X509_LOOKUP_METHOD *m;
  SSL *pSVar12;
  BIO_METHOD *type;
  BIO *bp;
  bool bVar13;
  char *local_398;
  char *local_388;
  char *local_378;
  char *local_370;
  SSL_METHOD *local_368;
  Curl_dns_entry *local_360;
  char *local_350;
  curl_blob *local_340;
  curl_closesocket_callback local_330;
  Curl_chunker *local_2e8;
  char *local_2e0;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  curl_blob *local_2b0;
  curl_blob *local_2a8;
  char *local_2a0;
  ulong local_298;
  char *local_290;
  SSL *handle;
  ssl_backend_data *proxy_backend;
  BIO *bio;
  char *snihost;
  char *curves;
  char *ciphers13;
  uchar protocols [128];
  int cur;
  _Bool imported_native_ca;
  ssl_backend_data *backend;
  char error_buffer [256];
  char *ssl_crlfile;
  _Bool verifypeer;
  char *ssl_capath;
  char *ssl_cafile;
  char *ssl_cert_type;
  curl_blob *ca_info_blob;
  curl_blob *ssl_cert_blob;
  char *ssl_cert;
  long ssl_version;
  in6_addr addr;
  char *hostname;
  SSL_SESSION *pSStack_60;
  _Bool sni;
  void *ssl_sessionid;
  ctx_option_t ctx_options;
  ssl_connect_data *connssl;
  X509_LOOKUP *pXStack_40;
  curl_socket_t sockfd;
  X509_LOOKUP *lookup;
  SSL_METHOD *req_method;
  char *ciphers;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  ciphers._0_4_ = 0;
  lookup = (X509_LOOKUP *)0x0;
  pXStack_40 = (X509_LOOKUP *)0x0;
  connssl._4_4_ = conn->sock[sockindex];
  ctx_options = (ctx_option_t)(conn->ssl + sockindex);
  ssl_sessionid = (void *)0x0;
  pSStack_60 = (SSL_SESSION *)0x0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_290 = (conn->http_proxy).host.name;
  }
  else {
    local_290 = (conn->host).name;
  }
  addr.__in6_u._8_8_ = local_290;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_298 = (conn->proxy_ssl_config).version;
  }
  else {
    local_298 = (conn->ssl_config).version;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2a0 = (data->set).proxy_ssl.primary.clientcert;
  }
  else {
    local_2a0 = (data->set).ssl.primary.clientcert;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2a8 = (data->set).proxy_ssl.primary.cert_blob;
  }
  else {
    local_2a8 = (data->set).ssl.primary.cert_blob;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2b0 = (conn->proxy_ssl_config).ca_info_blob;
  }
  else {
    local_2b0 = (conn->ssl_config).ca_info_blob;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2b8 = (data->set).proxy_ssl.cert_type;
  }
  else {
    local_2b8 = (data->set).ssl.cert_type;
  }
  if (local_2b0 == (curl_blob *)0x0) {
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
      local_2c8 = (conn->proxy_ssl_config).CAfile;
    }
    else {
      local_2c8 = (conn->ssl_config).CAfile;
    }
    local_2c0 = local_2c8;
  }
  else {
    local_2c0 = (char *)0x0;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2d0 = (conn->proxy_ssl_config).CApath;
  }
  else {
    local_2d0 = (conn->ssl_config).CApath;
  }
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = (conn->proxy_ssl_config).field_0x71;
  }
  else {
    bVar1 = (conn->ssl_config).field_0x71;
  }
  bVar13 = (bVar1 & 1) != 0;
  if (((conn->http_proxy).proxytype == '\x02') &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2e0 = (data->set).proxy_ssl.primary.CRLfile;
  }
  else {
    local_2e0 = (data->set).ssl.primary.CRLfile;
  }
  error_buffer._248_8_ = local_2e0;
  psVar2 = ((ssl_connect_data *)ctx_options)->backend;
  protocols[0x7f] = '\0';
  ciphers._4_4_ = sockindex;
  _result = conn;
  conn_local = (connectdata *)data;
  ciphers._0_4_ = ossl_seed(data);
  if ((CURLcode)ciphers != CURLE_OK) {
    return (CURLcode)ciphers;
  }
  if (((_result->http_proxy).proxytype == '\x02') &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    local_2e8 = (Curl_chunker *)&conn_local[1].socks_proxy.host.dispname;
  }
  else {
    local_2e8 = &conn_local[1].chunk;
  }
  local_2e8->datasize = 1;
  if (1 < local_298) {
    if (local_298 == 2) {
      Curl_failf((Curl_easy *)conn_local,"No SSLv2 support");
      return CURLE_NOT_BUILT_IN;
    }
    if (local_298 == 3) {
      Curl_failf((Curl_easy *)conn_local,"No SSLv3 support");
      return CURLE_NOT_BUILT_IN;
    }
    if (3 < local_298 - 4) {
      Curl_failf((Curl_easy *)conn_local,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
  lookup = (X509_LOOKUP *)TLS_client_method();
  pSVar7 = SSL_CTX_new((SSL_METHOD *)lookup);
  pcVar4 = conn_local;
  psVar2->ctx = (SSL_CTX *)pSVar7;
  if (psVar2->ctx == (SSL_CTX *)0x0) {
    uVar8 = ERR_peek_error();
    pcVar9 = ossl_strerror(uVar8,(char *)&backend,0x100);
    Curl_failf((Curl_easy *)pcVar4,"SSL: couldn\'t create a context: %s",pcVar9);
    return CURLE_OUT_OF_MEMORY;
  }
  SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x21,0x10,(void *)0x0);
  lVar10._0_4_ = conn_local->proxy_ssl[1].state;
  lVar10._4_4_ = conn_local->proxy_ssl[1].connecting_state;
  if ((lVar10 != 0) &&
     ((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >> 0x1b & 1) != 0)) {
    SSL_CTX_set_msg_callback((SSL_CTX *)psVar2->ctx,ossl_trace);
    SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x10,0,_result);
    (_result->ssl[0].backend)->logger = (Curl_easy *)conn_local;
  }
  if (((_result->http_proxy).proxytype == '\x02') &&
     (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
    bVar1 = *(byte *)&conn_local[1].http_proxy.host.dispname;
  }
  else {
    bVar1 = *(byte *)&conn_local[1].ip_addr;
  }
  ssl_sessionid = (void *)0x80024850;
  if ((bVar1 >> 2 & 1) == 0) {
    ssl_sessionid = (void *)0x80024050;
  }
  if (1 < local_298) {
    if (local_298 - 2 < 2) {
      return CURLE_NOT_BUILT_IN;
    }
    if (3 < local_298 - 4) {
      Curl_failf((Curl_easy *)conn_local,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
  ssl_sessionid = (void *)((ulong)ssl_sessionid | 0x2000000);
  ciphers._0_4_ = set_ssl_version_min_max(psVar2->ctx,_result);
  data_local._4_4_ = (CURLcode)ciphers;
  if ((CURLcode)ciphers == CURLE_OK) {
    SSL_CTX_set_options(psVar2->ctx,ssl_sessionid);
    if ((*(uint *)&(_result->bits).field_0x4 >> 0x1a & 1) != 0) {
      protocols[0x78] = '\0';
      protocols[0x79] = '\0';
      protocols[0x7a] = '\0';
      protocols[0x7b] = '\0';
      if ((2 < *(byte *)&conn_local[3].secondaryhostname) &&
         ((((_result->http_proxy).proxytype != '\x02' ||
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state == ssl_connection_complete
           )) || ((*(uint *)&(_result->bits).field_0x4 >> 3 & 1) == 0)))) {
        ciphers13._0_1_ = 2;
        ciphers13._1_1_ = 'h';
        ciphers13._2_1_ = '2';
        protocols[0x78] = '\x03';
        protocols[0x79] = '\0';
        protocols[0x7a] = '\0';
        protocols[0x7b] = '\0';
        Curl_infof((Curl_easy *)conn_local,"ALPN: offers %s","h2");
      }
      lVar10 = (long)(int)protocols._120_4_;
      protocols._120_4_ = protocols._120_4_ + 1;
      protocols[lVar10 + -8] = '\b';
      builtin_memcpy(protocols + (long)(int)protocols._120_4_ + -8,"http/1.1",8);
      protocols._120_4_ = protocols._120_4_ + 8;
      Curl_infof((Curl_easy *)conn_local,"ALPN: offers %s","http/1.1");
      iVar6 = SSL_CTX_set_alpn_protos(psVar2->ctx,&ciphers13,protocols._120_4_);
      if (iVar6 != 0) {
        Curl_failf((Curl_easy *)conn_local,"Error setting ALPN");
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    if (((local_2a0 != (char *)0x0) || (local_2a8 != (curl_blob *)0x0)) ||
       (local_2b8 != (char *)0x0)) {
      if ((CURLcode)ciphers == CURLE_OK) {
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          local_330 = (curl_closesocket_callback)conn_local[1].socks_proxy.passwd;
        }
        else {
          local_330 = conn_local[1].fclosesocket;
        }
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          local_340 = (curl_blob *)conn_local[1].http_proxy.host.rawalloc;
        }
        else {
          local_340 = (curl_blob *)conn_local[1].closesocket_client;
        }
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          local_350 = conn_local[1].http_proxy.host.encalloc;
        }
        else {
          local_350 = (char *)conn_local[1].connection_id;
        }
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          local_360 = (Curl_dns_entry *)conn_local[1].http_proxy.host.name;
        }
        else {
          local_360 = conn_local[1].dns_entry;
        }
        iVar6 = cert_stuff((Curl_easy *)conn_local,psVar2->ctx,local_2a0,local_2a8,local_2b8,
                           (char *)local_330,local_340,local_350,(char *)local_360);
        if (iVar6 == 0) {
          ciphers._0_4_ = CURLE_SSL_CERTPROBLEM;
        }
      }
      if ((CURLcode)ciphers != CURLE_OK) {
        return (CURLcode)ciphers;
      }
    }
    if (((_result->http_proxy).proxytype == '\x02') &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_368 = (SSL_METHOD *)(_result->proxy_ssl_config).cipher_list;
    }
    else {
      local_368 = (SSL_METHOD *)(_result->ssl_config).cipher_list;
    }
    req_method = local_368;
    if (local_368 == (SSL_METHOD *)0x0) {
      req_method = (SSL_METHOD *)0x0;
    }
    if (req_method != (SSL_METHOD *)0x0) {
      iVar6 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar2->ctx,(char *)req_method);
      if (iVar6 == 0) {
        Curl_failf((Curl_easy *)conn_local,"failed setting cipher list: %s",req_method);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof((Curl_easy *)conn_local,"Cipher selection: %s",req_method);
    }
    if (((_result->http_proxy).proxytype == '\x02') &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_370 = (_result->proxy_ssl_config).cipher_list13;
    }
    else {
      local_370 = (_result->ssl_config).cipher_list13;
    }
    if (local_370 != (char *)0x0) {
      iVar6 = SSL_CTX_set_ciphersuites(psVar2->ctx,local_370);
      if (iVar6 == 0) {
        Curl_failf((Curl_easy *)conn_local,"failed setting TLS 1.3 cipher suite: %s",local_370);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof((Curl_easy *)conn_local,"TLS 1.3 cipher selection: %s",local_370);
    }
    SSL_CTX_set_post_handshake_auth(psVar2->ctx);
    if (((_result->http_proxy).proxytype == '\x02') &&
       (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete)) {
      local_378 = (_result->proxy_ssl_config).curves;
    }
    else {
      local_378 = (_result->ssl_config).curves;
    }
    if ((local_378 == (char *)0x0) ||
       (lVar10 = SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x5c,0,local_378), lVar10 != 0)) {
      if ((local_2b0 != (curl_blob *)0x0) &&
         (ciphers._0_4_ = load_cacert_from_memory(psVar2->ctx,local_2b0),
         (CURLcode)ciphers != CURLE_OK)) {
        if (((CURLcode)ciphers == CURLE_OUT_OF_MEMORY) || ((bVar13 && ((protocols[0x7f] & 1) == 0)))
           ) {
          Curl_failf((Curl_easy *)conn_local,"error importing CA certificate blob");
          return (CURLcode)ciphers;
        }
        Curl_infof((Curl_easy *)conn_local,"error importing CA certificate blob, continuing anyway")
        ;
      }
      if (((bVar13) && ((protocols[0x7f] & 1) == 0)) &&
         ((local_2c0 != (char *)0x0 || (local_2d0 != (char *)0x0)))) {
        if ((local_2c0 != (char *)0x0) &&
           (iVar6 = SSL_CTX_load_verify_file(psVar2->ctx,local_2c0), iVar6 == 0)) {
          Curl_failf((Curl_easy *)conn_local,"error setting certificate file: %s",local_2c0);
          return CURLE_SSL_CACERT_BADFILE;
        }
        if ((local_2d0 != (char *)0x0) &&
           (iVar6 = SSL_CTX_load_verify_dir(psVar2->ctx,local_2d0), iVar6 == 0)) {
          Curl_failf((Curl_easy *)conn_local,"error setting certificate path: %s",local_2d0);
          return CURLE_SSL_CACERT_BADFILE;
        }
        if (local_2c0 == (char *)0x0) {
          local_388 = "none";
        }
        else {
          local_388 = local_2c0;
        }
        Curl_infof((Curl_easy *)conn_local," CAfile: %s",local_388);
        if (local_2d0 == (char *)0x0) {
          local_398 = "none";
        }
        else {
          local_398 = local_2d0;
        }
        Curl_infof((Curl_easy *)conn_local," CApath: %s",local_398);
      }
      if (error_buffer._248_8_ != 0) {
        pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
        m = X509_LOOKUP_file();
        pXStack_40 = X509_STORE_add_lookup(pXVar11,m);
        if ((pXStack_40 == (X509_LOOKUP *)0x0) ||
           (iVar6 = X509_load_crl_file(pXStack_40,(char *)error_buffer._248_8_,1), iVar6 == 0)) {
          Curl_failf((Curl_easy *)conn_local,"error loading CRL file: %s",error_buffer._248_8_);
          return CURLE_SSL_CRL_BADFILE;
        }
        Curl_infof((Curl_easy *)conn_local,"successfully loaded CRL file:");
        pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
        X509_STORE_set_flags(pXVar11,0xc);
        Curl_infof((Curl_easy *)conn_local,"  CRLfile: %s",error_buffer._248_8_);
      }
      if (bVar13) {
        pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
        X509_STORE_set_flags(pXVar11,0x8000);
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          bVar1 = *(byte *)&conn_local[1].http_proxy.host.dispname;
        }
        else {
          bVar1 = *(byte *)&conn_local[1].ip_addr;
        }
        if (((bVar1 >> 4 & 1) == 0) && (error_buffer._248_8_ == 0)) {
          pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
          X509_STORE_set_flags(pXVar11,0x80000);
        }
      }
      SSL_CTX_set_verify((SSL_CTX *)psVar2->ctx,(uint)bVar13,(callback *)0x0);
      _Var5 = Curl_tls_keylog_enabled();
      if (_Var5) {
        SSL_CTX_set_keylog_callback(psVar2->ctx,ossl_keylog_callback);
      }
      SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x2c,0x301,(void *)0x0);
      SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar2->ctx,ossl_new_session_cb);
      lVar3._0_4_ = conn_local[1].chunk.state;
      lVar3._4_1_ = conn_local[1].chunk.hexindex;
      lVar3._5_1_ = conn_local[1].chunk.hexbuffer[0];
      lVar3._6_1_ = conn_local[1].chunk.hexbuffer[1];
      lVar3._7_1_ = conn_local[1].chunk.hexbuffer[2];
      if (lVar3 != 0) {
        Curl_set_in_callback((Curl_easy *)conn_local,true);
        ciphers._0_4_ =
             (**(code **)&conn_local[1].chunk.state)
                       (conn_local,psVar2->ctx,*(undefined8 *)(conn_local[1].chunk.hexbuffer + 3));
        Curl_set_in_callback((Curl_easy *)conn_local,false);
        if ((CURLcode)ciphers != CURLE_OK) {
          Curl_failf((Curl_easy *)conn_local,"error signaled by ssl ctx callback");
          return (CURLcode)ciphers;
        }
      }
      if (psVar2->handle != (SSL *)0x0) {
        SSL_free((SSL *)psVar2->handle);
      }
      pSVar12 = SSL_new((SSL_CTX *)psVar2->ctx);
      psVar2->handle = (SSL *)pSVar12;
      if (psVar2->handle == (SSL *)0x0) {
        Curl_failf((Curl_easy *)conn_local,"SSL: couldn\'t create a context (handle)");
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        if (((_result->http_proxy).proxytype == '\x02') &&
           (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state != ssl_connection_complete
           )) {
          bVar1 = (_result->proxy_ssl_config).field_0x71;
        }
        else {
          bVar1 = (_result->ssl_config).field_0x71;
        }
        if ((bVar1 >> 2 & 1) != 0) {
          SSL_ctrl((SSL *)psVar2->handle,0x41,1,(void *)0x0);
        }
        SSL_set_connect_state((SSL *)psVar2->handle);
        psVar2->server_cert = (X509 *)0x0;
        iVar6 = inet_pton(2,(char *)addr.__in6_u._8_8_,&ssl_version);
        if (((iVar6 == 0) &&
            (iVar6 = inet_pton(10,(char *)addr.__in6_u._8_8_,&ssl_version), iVar6 == 0)) &&
           ((pcVar9 = Curl_ssl_snihost((Curl_easy *)conn_local,(char *)addr.__in6_u._8_8_,
                                       (size_t *)0x0), pcVar9 == (char *)0x0 ||
            (lVar10 = SSL_ctrl((SSL *)psVar2->handle,0x37,0,pcVar9), lVar10 == 0)))) {
          Curl_failf((Curl_easy *)conn_local,"Failed set SNI");
          data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
        }
        else {
          _Var5 = ossl_associate_connection((Curl_easy *)conn_local,_result,ciphers._4_4_);
          pcVar4 = conn_local;
          if (_Var5) {
            if (((_result->http_proxy).proxytype == '\x02') &&
               (_result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state !=
                ssl_connection_complete)) {
              bVar1 = *(byte *)((long)&conn_local[1].socks_proxy.host.name + 1);
            }
            else {
              bVar1 = *(byte *)((long)&conn_local[1].bundle_node.next + 1);
            }
            if ((bVar1 >> 3 & 1) != 0) {
              Curl_ssl_sessionid_lock((Curl_easy *)conn_local);
              _Var5 = false;
              if ((_result->http_proxy).proxytype == '\x02') {
                _Var5 = _result->proxy_ssl[(int)(uint)(_result->sock[1] != -1)].state !=
                        ssl_connection_complete;
              }
              _Var5 = Curl_ssl_getsessionid
                                ((Curl_easy *)conn_local,_result,_Var5,&stack0xffffffffffffffa0,
                                 (size_t *)0x0,ciphers._4_4_);
              if (!_Var5) {
                iVar6 = SSL_set_session((SSL *)psVar2->handle,pSStack_60);
                if (iVar6 == 0) {
                  Curl_ssl_sessionid_unlock((Curl_easy *)conn_local);
                  pcVar4 = conn_local;
                  uVar8 = ERR_get_error();
                  pcVar9 = ossl_strerror(uVar8,(char *)&backend,0x100);
                  Curl_failf((Curl_easy *)pcVar4,"SSL: SSL_set_session failed: %s",pcVar9);
                  return CURLE_SSL_CONNECT_ERROR;
                }
                Curl_infof((Curl_easy *)conn_local,"SSL re-using session ID");
              }
              Curl_ssl_sessionid_unlock((Curl_easy *)conn_local);
            }
            if ((_result->proxy_ssl[ciphers._4_4_].field_0x10 & 1) == 0) {
              iVar6 = SSL_set_fd((SSL *)psVar2->handle,connssl._4_4_);
              pcVar4 = conn_local;
              if (iVar6 == 0) {
                uVar8 = ERR_get_error();
                pcVar9 = ossl_strerror(uVar8,(char *)&backend,0x100);
                Curl_failf((Curl_easy *)pcVar4,"SSL: SSL_set_fd failed: %s",pcVar9);
                return CURLE_SSL_CONNECT_ERROR;
              }
            }
            else {
              type = BIO_f_ssl();
              bp = BIO_new(type);
              BIO_ctrl(bp,0x6d,0,(_result->proxy_ssl[ciphers._4_4_].backend)->handle);
              SSL_set_bio((SSL *)psVar2->handle,bp,bp);
            }
            *(undefined4 *)(ctx_options + 4) = 1;
            data_local._4_4_ = CURLE_OK;
          }
          else {
            uVar8 = ERR_get_error();
            pcVar9 = ossl_strerror(uVar8,(char *)&backend,0x100);
            Curl_failf((Curl_easy *)pcVar4,"SSL: ossl_associate_connection failed: %s",pcVar9);
            data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
          }
        }
      }
    }
    else {
      Curl_failf((Curl_easy *)conn_local,"failed setting curves list: \'%s\'",local_378);
      data_local._4_4_ = CURLE_SSL_CIPHER;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_connect_step1(struct Curl_easy *data,
                                   struct connectdata *conn, int sockindex)
{
  CURLcode result = CURLE_OK;
  char *ciphers;
  SSL_METHOD_QUAL SSL_METHOD *req_method = NULL;
  X509_LOOKUP *lookup = NULL;
  curl_socket_t sockfd = conn->sock[sockindex];
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  ctx_option_t ctx_options = 0;
  void *ssl_sessionid = NULL;

#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
  bool sni;
  const char * const hostname = SSL_HOST_NAME();

#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
#endif
  const long int ssl_version = SSL_CONN_CONFIG(version);
#ifdef USE_OPENSSL_SRP
  const enum CURL_TLSAUTH ssl_authtype = SSL_SET_OPTION(primary.authtype);
#endif
  char * const ssl_cert = SSL_SET_OPTION(primary.clientcert);
  const struct curl_blob *ssl_cert_blob = SSL_SET_OPTION(primary.cert_blob);
  const struct curl_blob *ca_info_blob = SSL_CONN_CONFIG(ca_info_blob);
  const char * const ssl_cert_type = SSL_SET_OPTION(cert_type);
  const char * const ssl_cafile =
    /* CURLOPT_CAINFO_BLOB overrides CURLOPT_CAINFO */
    (ca_info_blob ? NULL : SSL_CONN_CONFIG(CAfile));
  const char * const ssl_capath = SSL_CONN_CONFIG(CApath);
  const bool verifypeer = SSL_CONN_CONFIG(verifypeer);
  const char * const ssl_crlfile = SSL_SET_OPTION(primary.CRLfile);
  char error_buffer[256];
  struct ssl_backend_data *backend = connssl->backend;
  bool imported_native_ca = false;

  DEBUGASSERT(ssl_connect_1 == connssl->connecting_state);
  DEBUGASSERT(backend);

  /* Make funny stuff to get random input */
  result = ossl_seed(data);
  if(result)
    return result;

  SSL_SET_OPTION_LVALUE(certverifyresult) = !X509_V_OK;

  /* check to see if we've been told to use an explicit SSL/TLS version */

  switch(ssl_version) {
  case CURL_SSLVERSION_DEFAULT:
  case CURL_SSLVERSION_TLSv1:
  case CURL_SSLVERSION_TLSv1_0:
  case CURL_SSLVERSION_TLSv1_1:
  case CURL_SSLVERSION_TLSv1_2:
  case CURL_SSLVERSION_TLSv1_3:
    /* it will be handled later with the context options */
#if (OPENSSL_VERSION_NUMBER >= 0x10100000L)
    req_method = TLS_client_method();
#else
    req_method = SSLv23_client_method();
#endif
    use_sni(TRUE);
    break;
  case CURL_SSLVERSION_SSLv2:
    failf(data, "No SSLv2 support");
    return CURLE_NOT_BUILT_IN;
  case CURL_SSLVERSION_SSLv3:
    failf(data, "No SSLv3 support");
    return CURLE_NOT_BUILT_IN;
  default:
    failf(data, "Unrecognized parameter passed via CURLOPT_SSLVERSION");
    return CURLE_SSL_CONNECT_ERROR;
  }

  DEBUGASSERT(!backend->ctx);
  backend->ctx = SSL_CTX_new(req_method);

  if(!backend->ctx) {
    failf(data, "SSL: couldn't create a context: %s",
          ossl_strerror(ERR_peek_error(), error_buffer, sizeof(error_buffer)));
    return CURLE_OUT_OF_MEMORY;
  }

#ifdef SSL_MODE_RELEASE_BUFFERS
  SSL_CTX_set_mode(backend->ctx, SSL_MODE_RELEASE_BUFFERS);
#endif

#ifdef SSL_CTRL_SET_MSG_CALLBACK
  if(data->set.fdebug && data->set.verbose) {
    /* the SSL trace callback is only used for verbose logging */
    SSL_CTX_set_msg_callback(backend->ctx, ossl_trace);
    SSL_CTX_set_msg_callback_arg(backend->ctx, conn);
    set_logger(conn, data);
  }
#endif

  /* OpenSSL contains code to work around lots of bugs and flaws in various
     SSL-implementations. SSL_CTX_set_options() is used to enabled those
     work-arounds. The man page for this option states that SSL_OP_ALL enables
     all the work-arounds and that "It is usually safe to use SSL_OP_ALL to
     enable the bug workaround options if compatibility with somewhat broken
     implementations is desired."

     The "-no_ticket" option was introduced in OpenSSL 0.9.8j. It's a flag to
     disable "rfc4507bis session ticket support". rfc4507bis was later turned
     into the proper RFC5077: https://datatracker.ietf.org/doc/html/rfc5077

     The enabled extension concerns the session management. I wonder how often
     libcurl stops a connection and then resumes a TLS session. Also, sending
     the session data is some overhead. I suggest that you just use your
     proposed patch (which explicitly disables TICKET).

     If someone writes an application with libcurl and OpenSSL who wants to
     enable the feature, one can do this in the SSL callback.

     SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG option enabling allowed proper
     interoperability with web server Netscape Enterprise Server 2.0.1 which
     was released back in 1996.

     Due to CVE-2010-4180, option SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG has
     become ineffective as of OpenSSL 0.9.8q and 1.0.0c. In order to mitigate
     CVE-2010-4180 when using previous OpenSSL versions we no longer enable
     this option regardless of OpenSSL version and SSL_OP_ALL definition.

     OpenSSL added a work-around for a SSL 3.0/TLS 1.0 CBC vulnerability
     (https://www.openssl.org/~bodo/tls-cbc.txt). In 0.9.6e they added a bit to
     SSL_OP_ALL that _disables_ that work-around despite the fact that
     SSL_OP_ALL is documented to do "rather harmless" workarounds. In order to
     keep the secure work-around, the SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS bit
     must not be set.
  */

  ctx_options = SSL_OP_ALL;

#ifdef SSL_OP_NO_TICKET
  ctx_options |= SSL_OP_NO_TICKET;
#endif

#ifdef SSL_OP_NO_COMPRESSION
  ctx_options |= SSL_OP_NO_COMPRESSION;
#endif

#ifdef SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG
  /* mitigate CVE-2010-4180 */
  ctx_options &= ~SSL_OP_NETSCAPE_REUSE_CIPHER_CHANGE_BUG;
#endif

#ifdef SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS
  /* unless the user explicitly asks to allow the protocol vulnerability we
     use the work-around */
  if(!SSL_SET_OPTION(enable_beast))
    ctx_options &= ~SSL_OP_DONT_INSERT_EMPTY_FRAGMENTS;
#endif

  switch(ssl_version) {
    case CURL_SSLVERSION_SSLv2:
    case CURL_SSLVERSION_SSLv3:
      return CURLE_NOT_BUILT_IN;

    /* "--tlsv<x.y>" options mean TLS >= version <x.y> */
    case CURL_SSLVERSION_DEFAULT:
    case CURL_SSLVERSION_TLSv1: /* TLS >= version 1.0 */
    case CURL_SSLVERSION_TLSv1_0: /* TLS >= version 1.0 */
    case CURL_SSLVERSION_TLSv1_1: /* TLS >= version 1.1 */
    case CURL_SSLVERSION_TLSv1_2: /* TLS >= version 1.2 */
    case CURL_SSLVERSION_TLSv1_3: /* TLS >= version 1.3 */
      /* asking for any TLS version as the minimum, means no SSL versions
        allowed */
      ctx_options |= SSL_OP_NO_SSLv2;
      ctx_options |= SSL_OP_NO_SSLv3;

#if HAS_MODERN_SET_PROTO_VER /* 1.1.0 */
      result = set_ssl_version_min_max(backend->ctx, conn);
#else
      result = set_ssl_version_min_max_legacy(&ctx_options, data, conn,
                                              sockindex);
#endif
      if(result != CURLE_OK)
        return result;
      break;

    default:
      failf(data, "Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
  }

  SSL_CTX_set_options(backend->ctx, ctx_options);

#ifdef HAS_ALPN
  if(conn->bits.tls_enable_alpn) {
    int cur = 0;
    unsigned char protocols[128];

#ifdef USE_HTTP2
    if(data->state.httpwant >= CURL_HTTP_VERSION_2
#ifndef CURL_DISABLE_PROXY
       && (!SSL_IS_PROXY() || !conn->bits.tunnel_proxy)
#endif
      ) {
      protocols[cur++] = ALPN_H2_LENGTH;

      memcpy(&protocols[cur], ALPN_H2, ALPN_H2_LENGTH);
      cur += ALPN_H2_LENGTH;
      infof(data, VTLS_INFOF_ALPN_OFFER_1STR, ALPN_H2);
    }
#endif

    protocols[cur++] = ALPN_HTTP_1_1_LENGTH;
    memcpy(&protocols[cur], ALPN_HTTP_1_1, ALPN_HTTP_1_1_LENGTH);
    cur += ALPN_HTTP_1_1_LENGTH;
    infof(data, VTLS_INFOF_ALPN_OFFER_1STR, ALPN_HTTP_1_1);

    /* expects length prefixed preference ordered list of protocols in wire
     * format
     */
    if(SSL_CTX_set_alpn_protos(backend->ctx, protocols, cur)) {
      failf(data, "Error setting ALPN");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
#endif

  if(ssl_cert || ssl_cert_blob || ssl_cert_type) {
    if(!result &&
       !cert_stuff(data, backend->ctx,
                   ssl_cert, ssl_cert_blob, ssl_cert_type,
                   SSL_SET_OPTION(key), SSL_SET_OPTION(key_blob),
                   SSL_SET_OPTION(key_type), SSL_SET_OPTION(key_passwd)))
      result = CURLE_SSL_CERTPROBLEM;
    if(result)
      /* failf() is already done in cert_stuff() */
      return result;
  }

  ciphers = SSL_CONN_CONFIG(cipher_list);
  if(!ciphers)
    ciphers = (char *)DEFAULT_CIPHER_SELECTION;
  if(ciphers) {
    if(!SSL_CTX_set_cipher_list(backend->ctx, ciphers)) {
      failf(data, "failed setting cipher list: %s", ciphers);
      return CURLE_SSL_CIPHER;
    }
    infof(data, "Cipher selection: %s", ciphers);
  }

#ifdef HAVE_SSL_CTX_SET_CIPHERSUITES
  {
    char *ciphers13 = SSL_CONN_CONFIG(cipher_list13);
    if(ciphers13) {
      if(!SSL_CTX_set_ciphersuites(backend->ctx, ciphers13)) {
        failf(data, "failed setting TLS 1.3 cipher suite: %s", ciphers13);
        return CURLE_SSL_CIPHER;
      }
      infof(data, "TLS 1.3 cipher selection: %s", ciphers13);
    }
  }
#endif

#ifdef HAVE_SSL_CTX_SET_POST_HANDSHAKE_AUTH
  /* OpenSSL 1.1.1 requires clients to opt-in for PHA */
  SSL_CTX_set_post_handshake_auth(backend->ctx, 1);
#endif

#ifdef HAVE_SSL_CTX_SET_EC_CURVES
  {
    char *curves = SSL_CONN_CONFIG(curves);
    if(curves) {
      if(!SSL_CTX_set1_curves_list(backend->ctx, curves)) {
        failf(data, "failed setting curves list: '%s'", curves);
        return CURLE_SSL_CIPHER;
      }
    }
  }
#endif

#ifdef USE_OPENSSL_SRP
  if((ssl_authtype == CURL_TLSAUTH_SRP) &&
     Curl_auth_allowed_to_host(data)) {
    char * const ssl_username = SSL_SET_OPTION(primary.username);
    char * const ssl_password = SSL_SET_OPTION(primary.password);
    infof(data, "Using TLS-SRP username: %s", ssl_username);

    if(!SSL_CTX_set_srp_username(backend->ctx, ssl_username)) {
      failf(data, "Unable to set SRP user name");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if(!SSL_CTX_set_srp_password(backend->ctx, ssl_password)) {
      failf(data, "failed setting SRP password");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if(!SSL_CONN_CONFIG(cipher_list)) {
      infof(data, "Setting cipher list SRP");

      if(!SSL_CTX_set_cipher_list(backend->ctx, "SRP")) {
        failf(data, "failed setting SRP cipher list");
        return CURLE_SSL_CIPHER;
      }
    }
  }
#endif


#if defined(USE_WIN32_CRYPTO)
  /* Import certificates from the Windows root certificate store if requested.
     https://stackoverflow.com/questions/9507184/
     https://github.com/d3x0r/SACK/blob/master/src/netlib/ssl_layer.c#L1037
     https://datatracker.ietf.org/doc/html/rfc5280 */
  if((SSL_CONN_CONFIG(verifypeer) || SSL_CONN_CONFIG(verifyhost)) &&
     (SSL_SET_OPTION(native_ca_store))) {
    X509_STORE *store = SSL_CTX_get_cert_store(backend->ctx);
    HCERTSTORE hStore = CertOpenSystemStore(0, TEXT("ROOT"));

    if(hStore) {
      PCCERT_CONTEXT pContext = NULL;
      /* The array of enhanced key usage OIDs will vary per certificate and is
         declared outside of the loop so that rather than malloc/free each
         iteration we can grow it with realloc, when necessary. */
      CERT_ENHKEY_USAGE *enhkey_usage = NULL;
      DWORD enhkey_usage_size = 0;

      /* This loop makes a best effort to import all valid certificates from
         the MS root store. If a certificate cannot be imported it is skipped.
         'result' is used to store only hard-fail conditions (such as out of
         memory) that cause an early break. */
      result = CURLE_OK;
      for(;;) {
        X509 *x509;
        FILETIME now;
        BYTE key_usage[2];
        DWORD req_size;
        const unsigned char *encoded_cert;
#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
        char cert_name[256];
#endif

        pContext = CertEnumCertificatesInStore(hStore, pContext);
        if(!pContext)
          break;

#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
        if(!CertGetNameStringA(pContext, CERT_NAME_SIMPLE_DISPLAY_TYPE, 0,
                               NULL, cert_name, sizeof(cert_name))) {
          strcpy(cert_name, "Unknown");
        }
        infof(data, "SSL: Checking cert \"%s\"", cert_name);
#endif

        encoded_cert = (const unsigned char *)pContext->pbCertEncoded;
        if(!encoded_cert)
          continue;

        GetSystemTimeAsFileTime(&now);
        if(CompareFileTime(&pContext->pCertInfo->NotBefore, &now) > 0 ||
           CompareFileTime(&now, &pContext->pCertInfo->NotAfter) > 0)
          continue;

        /* If key usage exists check for signing attribute */
        if(CertGetIntendedKeyUsage(pContext->dwCertEncodingType,
                                   pContext->pCertInfo,
                                   key_usage, sizeof(key_usage))) {
          if(!(key_usage[0] & CERT_KEY_CERT_SIGN_KEY_USAGE))
            continue;
        }
        else if(GetLastError())
          continue;

        /* If enhanced key usage exists check for server auth attribute.
         *
         * Note "In a Microsoft environment, a certificate might also have EKU
         * extended properties that specify valid uses for the certificate."
         * The call below checks both, and behavior varies depending on what is
         * found. For more details see CertGetEnhancedKeyUsage doc.
         */
        if(CertGetEnhancedKeyUsage(pContext, 0, NULL, &req_size)) {
          if(req_size && req_size > enhkey_usage_size) {
            void *tmp = realloc(enhkey_usage, req_size);

            if(!tmp) {
              failf(data, "SSL: Out of memory allocating for OID list");
              result = CURLE_OUT_OF_MEMORY;
              break;
            }

            enhkey_usage = (CERT_ENHKEY_USAGE *)tmp;
            enhkey_usage_size = req_size;
          }

          if(CertGetEnhancedKeyUsage(pContext, 0, enhkey_usage, &req_size)) {
            if(!enhkey_usage->cUsageIdentifier) {
              /* "If GetLastError returns CRYPT_E_NOT_FOUND, the certificate is
                 good for all uses. If it returns zero, the certificate has no
                 valid uses." */
              if((HRESULT)GetLastError() != CRYPT_E_NOT_FOUND)
                continue;
            }
            else {
              DWORD i;
              bool found = false;

              for(i = 0; i < enhkey_usage->cUsageIdentifier; ++i) {
                if(!strcmp("1.3.6.1.5.5.7.3.1" /* OID server auth */,
                           enhkey_usage->rgpszUsageIdentifier[i])) {
                  found = true;
                  break;
                }
              }

              if(!found)
                continue;
            }
          }
          else
            continue;
        }
        else
          continue;

        x509 = d2i_X509(NULL, &encoded_cert, pContext->cbCertEncoded);
        if(!x509)
          continue;

        /* Try to import the certificate. This may fail for legitimate reasons
           such as duplicate certificate, which is allowed by MS but not
           OpenSSL. */
        if(X509_STORE_add_cert(store, x509) == 1) {
#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
          infof(data, "SSL: Imported cert \"%s\"", cert_name);
#endif
          imported_native_ca = true;
        }
        X509_free(x509);
      }

      free(enhkey_usage);
      CertFreeCertificateContext(pContext);
      CertCloseStore(hStore, 0);

      if(result)
        return result;
    }
    if(imported_native_ca)
      infof(data, "successfully imported Windows CA store");
    else
      infof(data, "error importing Windows CA store, continuing anyway");
  }
#endif

  if(ca_info_blob) {
    result = load_cacert_from_memory(backend->ctx, ca_info_blob);
    if(result) {
      if(result == CURLE_OUT_OF_MEMORY ||
         (verifypeer && !imported_native_ca)) {
        failf(data, "error importing CA certificate blob");
        return result;
      }
      /* Only warn if no certificate verification is required. */
      infof(data, "error importing CA certificate blob, continuing anyway");
    }
  }

  if(verifypeer && !imported_native_ca && (ssl_cafile || ssl_capath)) {
#if defined(OPENSSL_VERSION_MAJOR) && (OPENSSL_VERSION_MAJOR >= 3)
  /* OpenSSL 3.0.0 has deprecated SSL_CTX_load_verify_locations */
    if(ssl_cafile &&
       !SSL_CTX_load_verify_file(backend->ctx, ssl_cafile)) {
      /* Fail if we insist on successfully verifying the server. */
      failf(data, "error setting certificate file: %s", ssl_cafile);
      return CURLE_SSL_CACERT_BADFILE;
    }
    if(ssl_capath &&
       !SSL_CTX_load_verify_dir(backend->ctx, ssl_capath)) {
      /* Fail if we insist on successfully verifying the server. */
      failf(data, "error setting certificate path: %s", ssl_capath);
      return CURLE_SSL_CACERT_BADFILE;
    }
#else
    /* tell OpenSSL where to find CA certificates that are used to verify the
       server's certificate. */
    if(!SSL_CTX_load_verify_locations(backend->ctx, ssl_cafile, ssl_capath)) {
      /* Fail if we insist on successfully verifying the server. */
      failf(data, "error setting certificate verify locations:"
            "  CAfile: %s CApath: %s",
            ssl_cafile ? ssl_cafile : "none",
            ssl_capath ? ssl_capath : "none");
      return CURLE_SSL_CACERT_BADFILE;
    }
#endif
    infof(data, " CAfile: %s", ssl_cafile ? ssl_cafile : "none");
    infof(data, " CApath: %s", ssl_capath ? ssl_capath : "none");
  }

#ifdef CURL_CA_FALLBACK
  if(verifypeer &&
     !ca_info_blob && !ssl_cafile && !ssl_capath && !imported_native_ca) {
    /* verifying the peer without any CA certificates won't
       work so use openssl's built-in default as fallback */
    SSL_CTX_set_default_verify_paths(backend->ctx);
  }
#endif

  if(ssl_crlfile) {
    /* tell OpenSSL where to find CRL file that is used to check certificate
     * revocation */
    lookup = X509_STORE_add_lookup(SSL_CTX_get_cert_store(backend->ctx),
                                 X509_LOOKUP_file());
    if(!lookup ||
       (!X509_load_crl_file(lookup, ssl_crlfile, X509_FILETYPE_PEM)) ) {
      failf(data, "error loading CRL file: %s", ssl_crlfile);
      return CURLE_SSL_CRL_BADFILE;
    }
    /* Everything is fine. */
    infof(data, "successfully loaded CRL file:");
    X509_STORE_set_flags(SSL_CTX_get_cert_store(backend->ctx),
                         X509_V_FLAG_CRL_CHECK|X509_V_FLAG_CRL_CHECK_ALL);

    infof(data, "  CRLfile: %s", ssl_crlfile);
  }

  if(verifypeer) {
    /* Try building a chain using issuers in the trusted store first to avoid
       problems with server-sent legacy intermediates.  Newer versions of
       OpenSSL do alternate chain checking by default but we do not know how to
       determine that in a reliable manner.
       https://rt.openssl.org/Ticket/Display.html?id=3621&user=guest&pass=guest
    */
#if defined(X509_V_FLAG_TRUSTED_FIRST)
    X509_STORE_set_flags(SSL_CTX_get_cert_store(backend->ctx),
                         X509_V_FLAG_TRUSTED_FIRST);
#endif
#ifdef X509_V_FLAG_PARTIAL_CHAIN
    if(!SSL_SET_OPTION(no_partialchain) && !ssl_crlfile) {
      /* Have intermediate certificates in the trust store be treated as
         trust-anchors, in the same way as self-signed root CA certificates
         are. This allows users to verify servers using the intermediate cert
         only, instead of needing the whole chain.

         Due to OpenSSL bug https://github.com/openssl/openssl/issues/5081 we
         cannot do partial chains with a CRL check.
      */
      X509_STORE_set_flags(SSL_CTX_get_cert_store(backend->ctx),
                           X509_V_FLAG_PARTIAL_CHAIN);
    }
#endif
  }

  /* OpenSSL always tries to verify the peer, this only says whether it should
   * fail to connect if the verification fails, or if it should continue
   * anyway. In the latter case the result of the verification is checked with
   * SSL_get_verify_result() below. */
  SSL_CTX_set_verify(backend->ctx,
                     verifypeer ? SSL_VERIFY_PEER : SSL_VERIFY_NONE, NULL);

  /* Enable logging of secrets to the file specified in env SSLKEYLOGFILE. */
#ifdef HAVE_KEYLOG_CALLBACK
  if(Curl_tls_keylog_enabled()) {
    SSL_CTX_set_keylog_callback(backend->ctx, ossl_keylog_callback);
  }
#endif

  /* Enable the session cache because it's a prerequisite for the "new session"
   * callback. Use the "external storage" mode to prevent OpenSSL from creating
   * an internal session cache.
   */
  SSL_CTX_set_session_cache_mode(backend->ctx,
      SSL_SESS_CACHE_CLIENT | SSL_SESS_CACHE_NO_INTERNAL);
  SSL_CTX_sess_set_new_cb(backend->ctx, ossl_new_session_cb);

  /* give application a chance to interfere with SSL set up. */
  if(data->set.ssl.fsslctx) {
    Curl_set_in_callback(data, true);
    result = (*data->set.ssl.fsslctx)(data, backend->ctx,
                                      data->set.ssl.fsslctxp);
    Curl_set_in_callback(data, false);
    if(result) {
      failf(data, "error signaled by ssl ctx callback");
      return result;
    }
  }

  /* Let's make an SSL structure */
  if(backend->handle)
    SSL_free(backend->handle);
  backend->handle = SSL_new(backend->ctx);
  if(!backend->handle) {
    failf(data, "SSL: couldn't create a context (handle)");
    return CURLE_OUT_OF_MEMORY;
  }

#if (OPENSSL_VERSION_NUMBER >= 0x0090808fL) && !defined(OPENSSL_NO_TLSEXT) && \
    !defined(OPENSSL_NO_OCSP)
  if(SSL_CONN_CONFIG(verifystatus))
    SSL_set_tlsext_status_type(backend->handle, TLSEXT_STATUSTYPE_ocsp);
#endif

#if defined(OPENSSL_IS_BORINGSSL) && defined(ALLOW_RENEG)
  SSL_set_renegotiate_mode(backend->handle, ssl_renegotiate_freely);
#endif

  SSL_set_connect_state(backend->handle);

  backend->server_cert = 0x0;
#ifdef SSL_CTRL_SET_TLSEXT_HOSTNAME
  if((0 == Curl_inet_pton(AF_INET, hostname, &addr)) &&
#ifdef ENABLE_IPV6
     (0 == Curl_inet_pton(AF_INET6, hostname, &addr)) &&
#endif
     sni) {
    char *snihost = Curl_ssl_snihost(data, hostname, NULL);
    if(!snihost || !SSL_set_tlsext_host_name(backend->handle, snihost)) {
      failf(data, "Failed set SNI");
      return CURLE_SSL_CONNECT_ERROR;
    }
  }
#endif

  if(!ossl_associate_connection(data, conn, sockindex)) {
    /* Maybe the internal errors of SSL_get_ex_new_index or SSL_set_ex_data */
    failf(data, "SSL: ossl_associate_connection failed: %s",
          ossl_strerror(ERR_get_error(), error_buffer,
                        sizeof(error_buffer)));
    return CURLE_SSL_CONNECT_ERROR;
  }

  if(SSL_SET_OPTION(primary.sessionid)) {
    Curl_ssl_sessionid_lock(data);
    if(!Curl_ssl_getsessionid(data, conn, SSL_IS_PROXY() ? TRUE : FALSE,
                              &ssl_sessionid, NULL, sockindex)) {
      /* we got a session id, use it! */
      if(!SSL_set_session(backend->handle, ssl_sessionid)) {
        Curl_ssl_sessionid_unlock(data);
        failf(data, "SSL: SSL_set_session failed: %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)));
        return CURLE_SSL_CONNECT_ERROR;
      }
      /* Informational message */
      infof(data, "SSL re-using session ID");
    }
    Curl_ssl_sessionid_unlock(data);
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->proxy_ssl[sockindex].use) {
    BIO *const bio = BIO_new(BIO_f_ssl());
    struct ssl_backend_data *proxy_backend;
    SSL* handle = NULL;
    proxy_backend = conn->proxy_ssl[sockindex].backend;
    DEBUGASSERT(proxy_backend);
    handle = proxy_backend->handle;
    DEBUGASSERT(ssl_connection_complete == conn->proxy_ssl[sockindex].state);
    DEBUGASSERT(handle != NULL);
    DEBUGASSERT(bio != NULL);
    BIO_set_ssl(bio, handle, FALSE);
    SSL_set_bio(backend->handle, bio, bio);
  }
  else
#endif
    if(!SSL_set_fd(backend->handle, (int)sockfd)) {
    /* pass the raw socket into the SSL layers */
    failf(data, "SSL: SSL_set_fd failed: %s",
          ossl_strerror(ERR_get_error(), error_buffer, sizeof(error_buffer)));
    return CURLE_SSL_CONNECT_ERROR;
  }

  connssl->connecting_state = ssl_connect_2;

  return CURLE_OK;
}